

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.hpp
# Opt level: O0

void __thiscall
cinatra::session::session
          (session *this,string *session_id,size_t session_timeout,bool need_set_to_client)

{
  long lVar1;
  time_t tVar2;
  byte in_CL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  string *in_stack_00000010;
  string *in_stack_00000018;
  cookie *in_stack_00000020;
  
  std::__cxx11::string::string(in_RSI,in_RDX);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x20) = in_RDX;
  std::mutex::mutex((mutex *)0x1a5fbe);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   *)0x1a5fd1);
  cookie::cookie(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  *(byte *)(in_RDI + 0x160) = in_CL & 1;
  lVar1 = *(long *)(in_RDI + 0x20);
  tVar2 = time((time_t *)0x0);
  *(long *)(in_RDI + 0x28) = lVar1 + tVar2;
  cookie::set_max_age((cookie *)(in_RDI + 0x90),*(time_t *)(in_RDI + 0x20));
  return;
}

Assistant:

session(const std::string &session_id, std::size_t session_timeout,
          bool need_set_to_client)
      : session_id_(session_id),
        session_timeout_(session_timeout),
        cookie_(CSESSIONID, session_id_),
        need_set_to_client_(need_set_to_client) {
    time_stamp_ = session_timeout_ + std::time(nullptr);
    cookie_.set_max_age(session_timeout_);
  }